

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_free_window(nk_context *ctx,nk_window *win)

{
  nk_context *in_RSI;
  bool bVar1;
  nk_page_element *pe;
  nk_page_data *pd;
  nk_table *n;
  nk_table *it;
  nk_table *in_stack_ffffffffffffffd8;
  nk_context *in_stack_ffffffffffffffe0;
  nk_context *tbl;
  
  tbl = (nk_context *)(in_RSI->style).cursor_last;
  if (*(long *)&(in_RSI->input).mouse.buttons[1].clicked_pos.y != 0) {
    nk_free_window(in_RSI,(nk_window *)tbl);
    *(undefined8 *)&(in_RSI->input).mouse.buttons[1].clicked_pos.y = 0;
  }
  (in_RSI->style).text.padding.x = 0.0;
  (in_RSI->style).text.padding.y = 0.0;
  *(undefined8 *)&(in_RSI->style).button.normal = 0;
  while (tbl != (nk_context *)0x0) {
    in_stack_ffffffffffffffe0 = *(nk_context **)((long)&(tbl->style).button.normal.data + 0x10);
    nk_remove_table((nk_window *)in_RSI,(nk_table *)tbl);
    nk_free_table(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    bVar1 = tbl == (nk_context *)(in_RSI->style).cursor_last;
    tbl = in_stack_ffffffffffffffe0;
    if (bVar1) {
      (in_RSI->style).cursor_last = (nk_cursor *)in_stack_ffffffffffffffe0;
    }
  }
  nk_free_page_element(in_stack_ffffffffffffffe0,(nk_page_element *)in_RSI);
  return;
}

Assistant:

NK_LIB void
nk_free_window(struct nk_context *ctx, struct nk_window *win)
{
/* unlink windows from list */
struct nk_table *it = win->tables;
if (win->popup.win) {
nk_free_window(ctx, win->popup.win);
win->popup.win = 0;
}
win->next = 0;
win->prev = 0;

while (it) {
/*free window state tables */
struct nk_table *n = it->next;
nk_remove_table(win, it);
nk_free_table(ctx, it);
if (it == win->tables)
win->tables = n;
it = n;
}

/* link windows into freelist */
{union nk_page_data *pd = NK_CONTAINER_OF(win, union nk_page_data, win);
struct nk_page_element *pe = NK_CONTAINER_OF(pd, struct nk_page_element, data);
nk_free_page_element(ctx, pe);}
}